

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::eraseNode
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  Path *this_00;
  pointer pEVar1;
  NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
  *this_01;
  IntervalMap<unsigned_long,_std::monostate,_0U> *this_02;
  uint32_t uVar2;
  uint level_00;
  
  this_00 = &(this->super_const_iterator).path;
  level_00 = level - 1;
  if (level_00 == 0) {
    this_02 = (this->super_const_iterator).map;
    uVar2 = ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->
            offset;
    IntervalMapDetails::
    NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
    ::erase((NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
             *)this_02,uVar2,uVar2 + 1,this_02->rootSize);
    uVar2 = this_02->rootSize - 1;
    this_02->rootSize = uVar2;
    ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size =
         uVar2;
    if (uVar2 == 0) {
      memset(this_02,0,0xc4);
      const_iterator::setRoot(&this->super_const_iterator,0);
      return;
    }
  }
  else {
    pEVar1 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    this_01 = (NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
               *)pEVar1[level_00].node;
    uVar2 = pEVar1[level_00].size;
    if (uVar2 == 1) {
      this_01->first[0].pip.value = (uintptr_t)alloc->freeList;
      alloc->freeList = (FreeNode *)this_01;
      eraseNode(this,level_00,alloc);
    }
    else {
      IntervalMapDetails::
      NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
      ::erase(this_01,pEVar1[level_00].offset,pEVar1[level_00].offset + 1,uVar2);
      IntervalMapDetails::Path::setSize(this_00,level_00,uVar2 - 1);
      recomputeBounds(this,level_00);
    }
  }
  if (((this->super_const_iterator).path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0) &&
     (pEVar1 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar1->offset < pEVar1->size)) {
    IntervalMapDetails::Path::reset(this_00,level);
    (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[level].
    offset = 0;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::eraseNode(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    auto& map = *this->map;
    auto& path = this->path;

    if (--level == 0) {
        uint32_t offset = path.offset(0);
        map.rootBranch.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        if (map.empty()) {
            map.switchToLeaf();
            this->setRoot(0);
            return;
        }
    }
    else {
        auto& parent = path.template node<Branch>(level);
        if (path.size(level) == 1) {
            // Branch node became empty, remove it recursively.
            alloc.destroy(&parent);
            eraseNode(level, alloc);
        }
        else {
            // N.B. see note about updating parent bounds in erase()
            uint32_t offset = path.offset(level);
            uint32_t size = path.size(level);
            parent.erase(offset, offset + 1, size);
            path.setSize(level, size - 1);
            recomputeBounds(level);
        }
    }

    if (path.valid()) {
        path.reset(level + 1);
        path.offset(level + 1) = 0;
    }
}